

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MIL.pb.cc
# Opt level: O2

void __thiscall
CoreML::Specification::MILSpec::TensorValue_RepeatedStrings::SerializeWithCachedSizes
          (TensorValue_RepeatedStrings *this,CodedOutputStream *output)

{
  char *data;
  Type *pTVar1;
  int index;
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_00;
  int iVar2;
  
  iVar2 = (this->values_).super_RepeatedPtrFieldBase.current_size_;
  this_00 = &this->values_;
  index = 0;
  if (iVar2 < 1) {
    iVar2 = 0;
  }
  for (; iVar2 != index; index = index + 1) {
    pTVar1 = google::protobuf::internal::RepeatedPtrFieldBase::
             Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                       (&this_00->super_RepeatedPtrFieldBase,index);
    data = (pTVar1->_M_dataplus)._M_p;
    pTVar1 = google::protobuf::internal::RepeatedPtrFieldBase::
             Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                       (&this_00->super_RepeatedPtrFieldBase,index);
    google::protobuf::internal::WireFormatLite::VerifyUtf8String
              (data,(int)pTVar1->_M_string_length,SERIALIZE,
               "CoreML.Specification.MILSpec.TensorValue.RepeatedStrings.values");
    pTVar1 = google::protobuf::internal::RepeatedPtrFieldBase::
             Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                       (&this_00->super_RepeatedPtrFieldBase,index);
    google::protobuf::internal::WireFormatLite::WriteString(1,pTVar1,output);
  }
  return;
}

Assistant:

void TensorValue_RepeatedStrings::SerializeWithCachedSizes(
    ::google::protobuf::io::CodedOutputStream* output) const {
  // @@protoc_insertion_point(serialize_start:CoreML.Specification.MILSpec.TensorValue.RepeatedStrings)
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  // repeated string values = 1;
  for (int i = 0, n = this->values_size(); i < n; i++) {
    ::google::protobuf::internal::WireFormatLite::VerifyUtf8String(
      this->values(i).data(), this->values(i).length(),
      ::google::protobuf::internal::WireFormatLite::SERIALIZE,
      "CoreML.Specification.MILSpec.TensorValue.RepeatedStrings.values");
    ::google::protobuf::internal::WireFormatLite::WriteString(
      1, this->values(i), output);
  }

  // @@protoc_insertion_point(serialize_end:CoreML.Specification.MILSpec.TensorValue.RepeatedStrings)
}